

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

bool __thiscall nuraft::raft_server::reconnect_client(raft_server *this,peer *p)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  element_type *this_00;
  element_type *peVar5;
  unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *in_RSI;
  long in_RDI;
  context *in_stack_000000a8;
  ptr<srv_config> s_config;
  ptr<cluster_config> c_config;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff20;
  atomic<bool> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff48;
  string local_88 [80];
  __shared_ptr local_38 [16];
  undefined1 local_28 [16];
  unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffff28);
  if (bVar1) {
    local_1 = false;
  }
  else {
    iVar3 = (int)((ulong)local_28 >> 0x20);
    get_config((raft_server *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    this_00 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1da894);
    peer::get_id((peer *)0x1da8a6);
    cluster_config::get_server(this_00,iVar3);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if ((!bVar1) && (uVar2 = peer::is_leave_flag_set((peer *)0x1da8e6), (bool)uVar2)) {
      peer::get_config((peer *)0x1da906);
      srv_config::serialize((srv_config *)CONCAT17(uVar2,in_stack_ffffffffffffff48));
      std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                (in_stack_ffffffffffffff20);
      srv_config::deserialize
                ((buffer *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::shared_ptr<nuraft::srv_config>::operator=
                ((shared_ptr<nuraft::srv_config> *)in_stack_ffffffffffffff20,
                 (shared_ptr<nuraft::srv_config> *)
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1da962);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1da96f);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1daa0a);
        iVar3 = (*peVar5->_vptr_logger[7])();
        if (4 < iVar3) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1daa3a);
          uVar4 = peer::get_id((peer *)0x1daa4c);
          msg_if_given_abi_cxx11_((char *)local_88,"reset RPC client for peer %d",(ulong)uVar4);
          (*peVar5->_vptr_logger[8])
                    (peVar5,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"reconnect_client",0x3d2,local_88);
          std::__cxx11::string::~string(local_88);
        }
      }
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator*(local_18);
      local_1 = peer::recreate_rpc((peer *)s_config.
                                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi,
                                   (ptr<srv_config> *)
                                   s_config.
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,in_stack_000000a8);
    }
    else {
      local_1 = false;
    }
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1dab3e);
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x1dab4b);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool raft_server::reconnect_client(peer& p) {
    if (stopping_) return false;

    ptr<cluster_config> c_config = get_config();
    ptr<srv_config> s_config = c_config->get_server(p.get_id());

    // NOTE: To-be-removed server will not exist in config,
    //       but we still need to reconnect to it if we can
    //       send the latest config to the server.
    if (!s_config && p.is_leave_flag_set()) {
        s_config = srv_config::deserialize( *p.get_config().serialize() );
    }

    if (s_config) {
        p_db( "reset RPC client for peer %d",
              p.get_id() );
        return p.recreate_rpc(s_config, *ctx_);
    }
    return false;
}